

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void print_message<char[26],__2>
               (Printer *printer,char *path,size_t source_position,anon_class_1_0_00000001 *color,
               char *severity,char (*t) [26])

{
  char *pcVar1;
  char **ppcVar2;
  char c_00;
  bool bVar3;
  char local_131;
  PrintTuple<char[6],_char,_char[6]> local_130;
  PrintTuple<char[5],_PrintTuple<char[6],_char,_char[6]>,_char[6]> local_110;
  PrintNumber local_f0 [5];
  PrintNumber local_dc;
  Format<const_char_*,_PrintNumber,_PrintNumber> local_d8;
  PrintTuple<char[5],_Format<const_char_*,_PrintNumber,_PrintNumber>,_char[6]> local_b0;
  uint local_8c;
  int iStack_88;
  uint column;
  char *line_start;
  char *local_78;
  char *position;
  char *end;
  char *c;
  undefined1 local_58 [4];
  uint line_number;
  SourceFile file;
  char (*t_local) [26];
  char *severity_local;
  anon_class_1_0_00000001 *color_local;
  size_t source_position_local;
  char *path_local;
  Printer *printer_local;
  
  file.content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = t;
  source_position_local = (size_t)path;
  path_local = (char *)printer;
  if (path == (char *)0x0) {
    print_message<char[26],__2>(printer,color,severity,t);
  }
  else {
    SourceFile::SourceFile((SourceFile *)local_58,path);
    c._4_4_ = 1;
    end = SourceFile::begin((SourceFile *)local_58);
    position = SourceFile::end((SourceFile *)local_58);
    line_start = end + source_position;
    ppcVar2 = std::min<char_const*>(&line_start,&position);
    pcVar1 = path_local;
    local_78 = *ppcVar2;
    _iStack_88 = end;
    for (; end < local_78; end = end + 1) {
      if (*end == '\n') {
        _iStack_88 = end + 1;
        c._4_4_ = c._4_4_ + 1;
      }
    }
    local_8c = ((int)end - iStack_88) + 1;
    local_dc = print_number(c._4_4_);
    local_f0[0] = print_number(local_8c);
    format<char_const*,PrintNumber,PrintNumber>
              (&local_d8,"%:%:%: ",(char **)&source_position_local,&local_dc,local_f0);
    $_0::operator()(&local_b0,(__0 *)&bold,&local_d8);
    Printer::print<PrintTuple<char[5],Format<char_const*,PrintNumber,PrintNumber>,char[6]>>
              ((Printer *)pcVar1,&local_b0);
    print_message<char[26],__2>
              ((Printer *)path_local,color,severity,
               (char (*) [26])
               file.content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    end = _iStack_88;
    while( true ) {
      bVar3 = false;
      if (end < position) {
        bVar3 = *end != '\n';
      }
      if (!bVar3) break;
      Printer::print((Printer *)path_local,*end);
      end = end + 1;
    }
    Printer::print((Printer *)path_local,'\n');
    for (end = _iStack_88; pcVar1 = path_local, end < local_78; end = end + 1) {
      c_00 = ' ';
      if (*end == '\t') {
        c_00 = '\t';
      }
      Printer::print((Printer *)path_local,c_00);
    }
    local_131 = '^';
    $_2::operator()(&local_130,(__2 *)color,&local_131);
    $_0::operator()(&local_110,(__0 *)&bold,&local_130);
    Printer::print<PrintTuple<char[5],PrintTuple<char[6],char,char[6]>,char[6]>>
              ((Printer *)pcVar1,&local_110);
    Printer::print((Printer *)path_local,'\n');
    SourceFile::~SourceFile((SourceFile *)local_58);
  }
  return;
}

Assistant:

void print_message(const Printer& printer, const char* path, std::size_t source_position, const C& color, const char* severity, const T& t) {
	if (path == nullptr) {
		print_message(printer, color, severity, t);
	}
	else {
		SourceFile file(path);
		unsigned int line_number = 1;
		const char* c = file.begin();
		const char* end = file.end();
		const char* position = std::min(c + source_position, end);
		const char* line_start = c;
		while (c < position) {
			if (*c == '\n') {
				++c;
				++line_number;
				line_start = c;
			}
			else {
				++c;
			}
		}
		const unsigned int column = 1 + (c - line_start);

		printer.print(bold(format("%:%:%: ", path, print_number(line_number), print_number(column))));
		print_message(printer, color, severity, t);

		c = line_start;
		while (c < end && *c != '\n') {
			printer.print(*c);
			++c;
		}
		printer.print('\n');

		c = line_start;
		while (c < position) {
			printer.print(*c == '\t' ? '\t' : ' ');
			++c;
		}
		printer.print(bold(color('^')));
		printer.print('\n');
	}
}